

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc **ppsVar1;
  stbi__uint32 y;
  uint uVar2;
  stbi__context *s;
  stbi__context *psVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  stbi_uc sVar8;
  byte bVar9;
  stbi_uc sVar10;
  byte bVar11;
  byte bVar12;
  stbi__uint32 sVar13;
  stbi__uint32 sVar14;
  uint color;
  uint uVar15;
  uint uVar16;
  int iVar17;
  char *pcVar18;
  stbi_uc *psVar19;
  size_t sVar20;
  bool bVar21;
  ulong uVar22;
  long lVar23;
  stbi_uc *psVar24;
  ulong uVar25;
  int c;
  long lVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  stbi_uc *psVar32;
  long lVar33;
  uint len;
  long lVar34;
  long in_FS_OFFSET;
  int local_514;
  stbi_uc tc [3];
  ulong local_4d8;
  stbi__uint32 raw_len;
  stbi__png *local_4b0;
  stbi_uc *local_4a8;
  ulong local_4a0;
  stbi_uc *local_498;
  ulong local_490;
  size_t local_488;
  int local_480;
  int local_47c;
  ulong local_478;
  size_t local_470;
  stbi_uc *local_468;
  stbi__uint16 tc16 [3];
  stbi_uc palette [1024];
  
  tc[2] = '\0';
  tc[0] = '\0';
  tc[1] = '\0';
  s = z->s;
  ppsVar1 = &z->idata;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  lVar26 = 0;
  do {
    sVar8 = stbi__get8(s);
    sVar10 = (&stbi__check_png_header_png_sig)[lVar26];
    if (sVar8 != sVar10) {
      *(char **)(in_FS_OFFSET + -0x10) = "bad png sig";
      break;
    }
    lVar26 = lVar26 + 1;
  } while (lVar26 != 8);
  local_514 = 0;
  if ((sVar8 == sVar10) && (local_514 = 1, scan != 1)) {
    bVar5 = true;
    local_478 = 0;
    color = 0;
    bVar6 = false;
    local_4d8 = 0;
    local_470 = 0;
    len = 0;
    bVar7 = false;
    bVar11 = 0;
    do {
      sVar13 = stbi__get32be(s);
      sVar20 = (size_t)sVar13;
      sVar14 = stbi__get32be(s);
      uVar29 = (uint)local_4d8;
      uVar27 = len;
      if ((int)sVar14 < 0x49484452) {
        if (sVar14 == 0x43674249) {
          bVar6 = true;
LAB_001469a6:
          stbi__skip(s,sVar13);
LAB_00146b44:
          stbi__get32be(s);
          bVar4 = true;
          len = uVar27;
        }
        else {
          if (sVar14 == 0x49444154) {
            if (bVar5) goto LAB_00146a54;
            if ((bVar11 == 0) || (uVar29 != 0)) {
              if (scan == 2) {
                s->img_n = (uint)bVar11;
LAB_00146ba6:
                local_514 = 1;
                bVar5 = false;
                goto LAB_00146bb6;
              }
              uVar27 = sVar13 + len;
              if ((int)len <= (int)uVar27) {
                if ((uint)local_470 < uVar27) {
                  if (sVar13 < 0x1001) {
                    sVar20 = 0x1000;
                  }
                  if ((uint)local_470 != 0) {
                    sVar20 = local_470 & 0xffffffff;
                  }
                  do {
                    local_470 = sVar20;
                    sVar20 = (ulong)((uint)local_470 * 2);
                  } while ((uint)local_470 < uVar27);
                  psVar19 = (stbi_uc *)realloc(*ppsVar1,local_470);
                  if (psVar19 == (stbi_uc *)0x0) {
                    *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
                    goto LAB_00147362;
                  }
                  *ppsVar1 = psVar19;
                }
                iVar17 = stbi__getn(s,*ppsVar1 + len,sVar13);
                bVar5 = false;
                if (iVar17 != 0) goto LAB_00146b44;
                *(char **)(in_FS_OFFSET + -0x10) = "outofdata";
              }
LAB_00147362:
              bVar5 = false;
              local_514 = 0;
              bVar4 = false;
              goto LAB_00146bb8;
            }
            pcVar18 = "no PLTE";
LAB_00146a2c:
            *(char **)(in_FS_OFFSET + -0x10) = pcVar18;
            bVar5 = false;
            local_4d8 = 0;
            goto LAB_00146b6a;
          }
          if (sVar14 != 0x49454e44) {
LAB_001469db:
            if (bVar5) goto LAB_00146a54;
            bVar5 = false;
            if ((sVar14 >> 0x1d & 1) == 0) {
              stbi__parse_png_file::invalid_chunk._0_4_ =
                   sVar14 >> 0x18 | (sVar14 & 0xff0000) >> 8 | (sVar14 & 0xff00) << 8 |
                   sVar14 << 0x18;
              pcVar18 = stbi__parse_png_file::invalid_chunk;
              goto LAB_00146b57;
            }
            goto LAB_001469a6;
          }
          if (bVar5) {
            *(char **)(in_FS_OFFSET + -0x10) = "first not IHDR";
LAB_0014692a:
            local_514 = 0;
          }
          else if (scan == 0) {
            if (*ppsVar1 == (stbi_uc *)0x0) {
              *(char **)(in_FS_OFFSET + -0x10) = "no IDAT";
              goto LAB_0014692a;
            }
            raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
            psVar19 = (stbi_uc *)
                      stbi_zlib_decode_malloc_guesssize_headerflag
                                ((char *)*ppsVar1,len,raw_len,(int *)&raw_len,(uint)!bVar6);
            z->expanded = psVar19;
            local_514 = 0;
            if (psVar19 != (stbi_uc *)0x0) {
              free(*ppsVar1);
              sVar13 = raw_len;
              *ppsVar1 = (stbi_uc *)0x0;
              iVar17 = s->img_n + 1;
              if (bVar7 || (bVar11 == 0 && req_comp != 3) && iVar17 == req_comp) {
                s->img_out_n = iVar17;
              }
              else {
                s->img_out_n = s->img_n;
              }
              psVar19 = z->expanded;
              iVar28 = s->img_out_n;
              uVar27 = z->depth;
              c = iVar28 << (uVar27 == 0x10);
              sVar14 = z->s->img_x;
              y = z->s->img_y;
              local_4b0 = z;
              if ((int)local_478 == 0) {
                iVar17 = stbi__create_png_image_raw(z,psVar19,raw_len,iVar28,sVar14,y,uVar27,color);
                if (iVar17 == 0) goto LAB_00146bb6;
              }
              else {
                local_4a0 = (ulong)uVar27;
                local_480 = iVar28;
                local_4a8 = (stbi_uc *)
                            stbi__malloc_mad3(sVar14,y,c,
                                              CONCAT31((int3)((uint)iVar17 >> 8),uVar27 == 0x10));
                local_488 = (size_t)c;
                lVar26 = 0;
                uVar22 = local_4a0;
                do {
                  psVar3 = z->s;
                  local_498 = (stbi_uc *)(long)(int)(&DAT_001681c0)[lVar26];
                  uVar27 = (&DAT_00168200)[lVar26];
                  uVar31 = ~(&DAT_001681c0)[lVar26] + psVar3->img_x + uVar27;
                  uVar15 = uVar31 / uVar27;
                  uVar29 = (&DAT_001681e0)[lVar26];
                  uVar2 = (&DAT_00168220)[lVar26];
                  uVar30 = ~uVar29 + psVar3->img_y + uVar2;
                  uVar16 = uVar30 / uVar2;
                  bVar21 = true;
                  if ((uVar27 <= uVar31) && (uVar2 <= uVar30)) {
                    local_47c = uVar15 * (int)uVar22 * psVar3->img_n;
                    local_468 = psVar19;
                    iVar17 = stbi__create_png_image_raw
                                       (z,psVar19,sVar13,local_480,uVar15,uVar16,(int)uVar22,color);
                    if (iVar17 == 0) {
                      free(local_4a8);
                      bVar21 = false;
                      uVar22 = local_4a0;
                      psVar19 = local_468;
                    }
                    else {
                      if (0 < (int)uVar16) {
                        iVar17 = (int)local_488;
                        iVar28 = uVar29 * iVar17;
                        local_498 = local_4a8 + (long)local_498 * local_488;
                        lVar23 = (long)(int)uVar27 * local_488;
                        local_490 = 0;
                        sVar20 = local_488;
                        do {
                          if (0 < (int)uVar15) {
                            psVar3 = local_4b0->s;
                            psVar19 = local_4b0->out;
                            lVar33 = local_490 * (long)(int)uVar15;
                            lVar34 = 0;
                            psVar32 = local_498;
                            do {
                              memcpy(psVar32 + psVar3->img_x * iVar28,
                                     psVar19 + (lVar34 + lVar33) * sVar20,local_488);
                              lVar34 = lVar34 + 1;
                              psVar32 = psVar32 + lVar23;
                              sVar20 = local_488;
                            } while (lVar34 < (int)uVar15);
                          }
                          local_490 = local_490 + 1;
                          iVar28 = iVar28 + uVar2 * iVar17;
                        } while (local_490 < uVar16);
                      }
                      z = local_4b0;
                      uVar16 = ((local_47c + 7 >> 3) + 1) * uVar16;
                      free(local_4b0->out);
                      sVar13 = sVar13 - uVar16;
                      bVar21 = true;
                      uVar22 = local_4a0;
                      psVar19 = local_468 + uVar16;
                    }
                  }
                  if (!bVar21) goto LAB_00146bb6;
                  lVar26 = lVar26 + 1;
                } while (lVar26 != 7);
                z->out = local_4a8;
              }
              if (bVar7) {
                if (z->depth == 0x10) {
                  stbi__compute_transparency16(z,tc16,s->img_out_n);
                }
                else {
                  stbi__compute_transparency(z,tc,s->img_out_n);
                }
              }
              if (((bVar6) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
                stbi__de_iphone(z);
              }
              if (bVar11 == 0) {
                if (bVar7) {
                  s->img_n = s->img_n + 1;
                }
              }
              else {
                s->img_n = (uint)bVar11;
                uVar27 = (uint)bVar11;
                if (2 < req_comp) {
                  uVar27 = req_comp;
                }
                s->img_out_n = uVar27;
                psVar19 = z->out;
                uVar29 = z->s->img_y * z->s->img_x;
                if (((int)uVar29 < 0) ||
                   ((uVar27 != 0 && ((int)(0x7fffffff / (ulong)uVar27) < (int)uVar29)))) {
                  psVar32 = (stbi_uc *)0x0;
                }
                else {
                  psVar32 = (stbi_uc *)malloc((ulong)(uVar29 * uVar27));
                }
                if (psVar32 == (stbi_uc *)0x0) {
                  *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
                }
                else {
                  if (uVar27 == 3) {
                    if (uVar29 != 0) {
                      uVar22 = 0;
                      psVar24 = psVar32;
                      do {
                        uVar25 = (ulong)psVar19[uVar22];
                        *psVar24 = palette[uVar25 * 4];
                        psVar24[1] = palette[uVar25 * 4 + 1];
                        psVar24[2] = palette[uVar25 * 4 + 2];
                        psVar24 = psVar24 + 3;
                        uVar22 = uVar22 + 1;
                      } while (uVar29 != uVar22);
                    }
                  }
                  else if (uVar29 != 0) {
                    uVar22 = 0;
                    do {
                      uVar25 = (ulong)psVar19[uVar22];
                      psVar32[uVar22 * 4] = palette[uVar25 * 4];
                      psVar32[uVar22 * 4 + 1] = palette[uVar25 * 4 + 1];
                      psVar32[uVar22 * 4 + 2] = palette[uVar25 * 4 + 2];
                      psVar32[uVar22 * 4 + 3] = palette[uVar25 * 4 + 3];
                      uVar22 = uVar22 + 1;
                    } while (uVar29 != uVar22);
                  }
                  free(psVar19);
                  local_4b0->out = psVar32;
                }
                z = local_4b0;
                if (psVar32 == (stbi_uc *)0x0) goto LAB_00146bb6;
              }
              free(z->expanded);
              z->expanded = (stbi_uc *)0x0;
              stbi__get32be(s);
              goto LAB_00146a77;
            }
          }
          else {
LAB_00146a77:
            local_514 = 1;
          }
LAB_00146bb6:
          bVar4 = false;
        }
      }
      else {
        if (sVar14 == 0x74524e53) {
          if (!bVar5) {
            if (*ppsVar1 == (stbi_uc *)0x0) {
              if (bVar11 == 0) {
                if ((s->img_n & 1U) == 0) {
                  pcVar18 = "tRNS with alpha";
                }
                else {
                  if (s->img_n * 2 == sVar13) {
                    bVar7 = true;
                    if (z->depth == 0x10) {
                      if (0 < s->img_n) {
                        lVar26 = 0;
                        do {
                          sVar10 = stbi__get8(s);
                          sVar8 = stbi__get8(s);
                          tc16[lVar26] = CONCAT11(sVar10,sVar8);
                          lVar26 = lVar26 + 1;
                        } while (lVar26 < s->img_n);
                      }
                    }
                    else if (0 < s->img_n) {
                      lVar26 = 0;
                      do {
                        stbi__get8(s);
                        sVar10 = stbi__get8(s);
                        tc[lVar26] = ""[z->depth] * sVar10;
                        lVar26 = lVar26 + 1;
                      } while (lVar26 < s->img_n);
                    }
                    bVar5 = false;
                    bVar11 = 0;
                    goto LAB_00146b44;
                  }
                  pcVar18 = "bad tRNS len";
                }
                *(char **)(in_FS_OFFSET + -0x10) = pcVar18;
                bVar5 = false;
                bVar11 = 0;
                goto LAB_00146b6a;
              }
              if (scan == 2) {
                s->img_n = 4;
                goto LAB_00146ba6;
              }
              if (uVar29 == 0) {
                pcVar18 = "tRNS before PLTE";
                goto LAB_00146a2c;
              }
              if (sVar13 <= uVar29) {
                bVar11 = 4;
                bVar5 = false;
                if (sVar13 != 0) {
                  uVar22 = 0;
                  do {
                    sVar10 = stbi__get8(s);
                    palette[uVar22 * 4 + 3] = sVar10;
                    uVar22 = uVar22 + 1;
                  } while (sVar20 != uVar22);
                  goto LAB_00146b10;
                }
                goto LAB_00146b44;
              }
              pcVar18 = "bad tRNS len";
            }
            else {
              pcVar18 = "tRNS after IDAT";
            }
LAB_00146b57:
            *(char **)(in_FS_OFFSET + -0x10) = pcVar18;
            bVar5 = false;
            goto LAB_00146b6a;
          }
        }
        else {
          if (sVar14 != 0x504c5445) {
            if (sVar14 != 0x49484452) goto LAB_001469db;
            if (bVar5) {
              if (sVar13 != 0xd) {
                pcVar18 = "bad IHDR len";
                goto LAB_00146b20;
              }
              sVar13 = stbi__get32be(s);
              s->img_x = sVar13;
              sVar13 = stbi__get32be(s);
              s->img_y = sVar13;
              if ((0x1000000 < sVar13) || (0x1000000 < s->img_x)) {
                pcVar18 = "too large";
                goto LAB_00146b20;
              }
              bVar9 = stbi__get8(s);
              z->depth = (uint)bVar9;
              if ((0x10 < bVar9) || ((0x10116U >> (bVar9 & 0x1f) & 1) == 0)) {
                pcVar18 = "1/2/4/8/16-bit only";
                goto LAB_00146b20;
              }
              bVar9 = stbi__get8(s);
              color = (uint)bVar9;
              if (6 < bVar9) {
LAB_00146d20:
                pcVar18 = "bad ctype";
                goto LAB_00146b20;
              }
              if (bVar9 == 3) {
                bVar12 = 3;
                if (z->depth != 0x10) goto LAB_001471c4;
                *(char **)(in_FS_OFFSET + -0x10) = "bad ctype";
                color = 3;
                goto LAB_00146db2;
              }
              bVar12 = bVar11;
              if ((bVar9 & 1) != 0) goto LAB_00146d20;
LAB_001471c4:
              bVar11 = bVar12;
              sVar10 = stbi__get8(s);
              if (sVar10 == '\0') {
                sVar10 = stbi__get8(s);
                if (sVar10 != '\0') {
                  pcVar18 = "bad filter method";
                  goto LAB_0014757e;
                }
                bVar12 = stbi__get8(s);
                local_478 = (ulong)bVar12;
                if (1 < bVar12) {
                  pcVar18 = "bad interlace method";
                  goto LAB_0014757e;
                }
                uVar29 = s->img_x;
                if ((uVar29 == 0) || (uVar2 = s->img_y, uVar2 == 0)) {
                  pcVar18 = "0-pixel image";
                  goto LAB_0014757e;
                }
                if (bVar11 == 0) {
                  uVar15 = (3 < bVar9) + 1 + (bVar9 & 2);
                  s->img_n = uVar15;
                  if ((uint)((0x40000000 / (ulong)uVar29) / (ulong)uVar15) < uVar2) {
                    *(char **)(in_FS_OFFSET + -0x10) = "too large";
                    bVar11 = 0;
                    goto LAB_00146db2;
                  }
                  if (scan != 2) goto LAB_00147617;
                  local_514 = 1;
                  bVar21 = false;
                  bVar11 = 0;
                }
                else {
                  s->img_n = 1;
                  if ((uint)(0x40000000 / (ulong)uVar29 >> 2) < uVar2) {
                    *(char **)(in_FS_OFFSET + -0x10) = "too large";
LAB_00146db2:
                    bVar21 = false;
                    local_514 = 0;
                  }
                  else {
LAB_00147617:
                    bVar21 = true;
                  }
                }
              }
              else {
                pcVar18 = "bad comp method";
LAB_0014757e:
                *(char **)(in_FS_OFFSET + -0x10) = pcVar18;
                bVar21 = false;
                local_514 = 0;
              }
            }
            else {
              pcVar18 = "multiple IHDR";
LAB_00146b20:
              *(char **)(in_FS_OFFSET + -0x10) = pcVar18;
              bVar21 = false;
              local_514 = 0;
            }
            bVar5 = false;
            bVar4 = false;
            if (!bVar21) goto LAB_00146bb8;
            goto LAB_00146b44;
          }
          if (!bVar5) {
            if ((sVar13 < 0x301) && (local_4d8 = sVar20 / 3, (sVar13 / 3) * 3 == sVar13)) {
              bVar5 = false;
              if (2 < sVar13) {
                uVar22 = 0;
                do {
                  sVar10 = stbi__get8(s);
                  palette[uVar22 * 4] = sVar10;
                  sVar10 = stbi__get8(s);
                  palette[uVar22 * 4 + 1] = sVar10;
                  sVar10 = stbi__get8(s);
                  palette[uVar22 * 4 + 2] = sVar10;
                  palette[uVar22 * 4 + 3] = 0xff;
                  uVar22 = uVar22 + 1;
                } while (local_4d8 != uVar22);
LAB_00146b10:
                bVar5 = false;
              }
              goto LAB_00146b44;
            }
            pcVar18 = "invalid PLTE";
            goto LAB_00146b57;
          }
        }
LAB_00146a54:
        *(char **)(in_FS_OFFSET + -0x10) = "first not IHDR";
        bVar5 = true;
LAB_00146b6a:
        bVar4 = false;
        local_514 = 0;
      }
LAB_00146bb8:
    } while (bVar4);
  }
  return local_514;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s);
            s->img_y = stbi__get32be(s);
            if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}